

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayBuffer.cpp
# Opt level: O0

ArrayBufferDetachedStateBase * __thiscall
Js::ArrayBuffer::DetachAndGetState(ArrayBuffer *this,bool queueForDelayFree)

{
  RefCountedBuffer *pRVar1;
  int iVar2;
  undefined4 extraout_var;
  ArrayBufferDetachedStateBase *pAVar3;
  ScriptContext *this_00;
  ThreadContext *this_01;
  DelayedFreeArrayBuffer *this_02;
  undefined4 extraout_var_00;
  DelayedFreeArrayBuffer *local;
  BasePtr<Js::ArrayBufferDetachedStateBase> local_20;
  AutoPtr<Js::ArrayBufferDetachedStateBase,_Memory::HeapAllocator> arrayBufferState;
  bool queueForDelayFree_local;
  ArrayBuffer *this_local;
  
  arrayBufferState.super_BasePtr<Js::ArrayBufferDetachedStateBase>.ptr._7_1_ = queueForDelayFree;
  iVar2 = (*(this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x78])
                    (this,this->bufferContent,(ulong)this->bufferLength);
  AutoPtr<Js::ArrayBufferDetachedStateBase,_Memory::HeapAllocator>::AutoPtr
            ((AutoPtr<Js::ArrayBufferDetachedStateBase,_Memory::HeapAllocator> *)&local_20,
             (ArrayBufferDetachedStateBase *)CONCAT44(extraout_var,iVar2));
  Detach(this);
  if ((arrayBufferState.super_BasePtr<Js::ArrayBufferDetachedStateBase>.ptr._7_1_ & 1) != 0) {
    pAVar3 = BasePtr<Js::ArrayBufferDetachedStateBase>::operator->(&local_20);
    if (pAVar3->buffer != (RefCountedBuffer *)0x0) {
      this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      this_01 = ScriptContext::GetThreadContext(this_00);
      this_02 = ThreadContext::GetScanStackCallback(this_01);
      pAVar3 = BasePtr<Js::ArrayBufferDetachedStateBase>::operator->(&local_20);
      pRVar1 = pAVar3->buffer;
      pAVar3 = BasePtr<Js::ArrayBufferDetachedStateBase>::operator->(&local_20);
      iVar2 = (*(this->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                [0x76])(this,pRVar1,(ulong)pAVar3->bufferLength);
      DelayedFreeArrayBuffer::Push
                (this_02,(ArrayBufferContentForDelayedFreeBase *)CONCAT44(extraout_var_00,iVar2));
    }
  }
  pAVar3 = BasePtr<Js::ArrayBufferDetachedStateBase>::Detach(&local_20);
  AutoPtr<Js::ArrayBufferDetachedStateBase,_Memory::HeapAllocator>::~AutoPtr
            ((AutoPtr<Js::ArrayBufferDetachedStateBase,_Memory::HeapAllocator> *)&local_20);
  return pAVar3;
}

Assistant:

ArrayBufferDetachedStateBase* ArrayBuffer::DetachAndGetState(bool queueForDelayFree/* = true*/)
    {
        // Save the state before detaching
        AutoPtr<ArrayBufferDetachedStateBase> arrayBufferState(this->CreateDetachedState(this->bufferContent, this->bufferLength));
        Detach();

        // Now put this bufferContent to the queue so that we can manage the lifetime of the buffer later.
        if (queueForDelayFree && arrayBufferState->buffer != nullptr)
        {
            DelayedFreeArrayBuffer * local = GetScriptContext()->GetThreadContext()->GetScanStackCallback();
            local->Push(this->CopyBufferContentForDelayedFree(arrayBufferState->buffer, arrayBufferState->bufferLength));
        }

        return arrayBufferState.Detach();
    }